

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

GLuint __thiscall CS248::OSDText::compile_shaders(OSDText *this)

{
  pointer *ppcVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  int iVar6;
  long *plVar7;
  char *__s;
  long *plVar8;
  int info_length;
  GLint result;
  vector<char,_std::allocator<char>_> vert_shader_errmsg;
  string frag_shader_src;
  string version;
  string vert_shader_src;
  char *src;
  allocator_type local_c1;
  uint local_c0;
  GLint local_bc;
  vector<char,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  long *local_38;
  
  GVar3 = (*__glewCreateShader)(0x8b31);
  GVar4 = (*__glewCreateShader)(0x8b30);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"#version 130\n","");
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "in vec4 coord;\nout vec2 texpos;\nvoid main(void) {\n  gl_Position = vec4(coord.xy, 0, 1);\n  texpos = coord.zw;\n}"
             ,"");
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78[0]);
  local_58 = &local_48;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_48 = *plVar8;
    lStack_40 = plVar7[3];
  }
  else {
    local_48 = *plVar8;
    local_58 = (long *)*plVar7;
  }
  local_50 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  ppcVar1 = &local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "uniform sampler2D tex;\nuniform vec4 color;\nin vec2 texpos;\nout vec4 fragColor;\nvoid main(void) {\n  fragColor = vec4(1, 1, 1, texture(tex, texpos).r) * color;\n}"
             ,"");
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_78[0]);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_88 = *plVar8;
    lStack_80 = plVar7[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar8;
    local_98 = (long *)*plVar7;
  }
  local_90 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((pointer *)
      local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar1) {
    operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_bc = 0;
  local_38 = local_58;
  (*__glewShaderSource)(GVar3,1,(GLchar **)&local_38,(GLint *)0x0);
  (*__glewCompileShader)(GVar3);
  (*__glewGetShaderiv)(GVar3,0x8b81,&local_bc);
  (*__glewGetShaderiv)(GVar3,0x8b84,(GLint *)&local_c0);
  if (0 < (int)local_c0) {
    std::vector<char,_std::allocator<char>_>::vector(&local_b8,(ulong)local_c0 + 1,&local_c1);
    (*__glewGetShaderInfoLog)
              (GVar3,local_c0,(GLsizei *)0x0,
               local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    puts(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start);
    if ((pointer *)
        local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_38 = local_98;
  (*__glewShaderSource)(GVar4,1,(GLchar **)&local_38,(GLint *)0x0);
  (*__glewCompileShader)(GVar4);
  (*__glewGetShaderiv)(GVar4,0x8b81,&local_bc);
  (*__glewGetShaderiv)(GVar4,0x8b84,(GLint *)&local_c0);
  if (0 < (int)local_c0) {
    std::vector<char,_std::allocator<char>_>::vector(&local_b8,(ulong)local_c0 + 1,&local_c1);
    (*__glewGetShaderInfoLog)
              (GVar4,local_c0,(GLsizei *)0x0,
               local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    puts(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start);
    if ((pointer *)
        local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  GVar5 = (*__glewCreateProgram)();
  (*__glewAttachShader)(GVar5,GVar3);
  (*__glewAttachShader)(GVar5,GVar4);
  (*__glewLinkProgram)(GVar5);
  (*__glewGetProgramiv)(GVar5,0x8b82,&local_bc);
  (*__glewGetProgramiv)(GVar5,0x8b84,(GLint *)&local_c0);
  if (0 < (int)local_c0) {
    std::vector<char,_std::allocator<char>_>::vector(&local_b8,(ulong)local_c0 + 1,&local_c1);
    (*__glewGetProgramInfoLog)
              (GVar5,local_c0,(GLsizei *)0x0,
               local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    puts(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start);
    if ((pointer *)
        local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_bc == 0) {
    (*__glewGetProgramiv)(GVar5,0x8b84,(GLint *)&local_b8);
    iVar2 = (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    iVar6 = -1;
    if (-1 < (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      iVar6 = (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    __s = (char *)operator_new__((long)iVar6);
    (*__glewGetProgramInfoLog)(GVar5,iVar2,(GLsizei *)&local_b8,__s);
    puts("GLSL Linker Error:");
    puts("================================================================================");
    puts(__s);
    putchar(10);
    operator_delete__(__s);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  return GVar5;
}

Assistant:

GLuint OSDText::compile_shaders() {

  // create the shaders
  GLuint vert_shader = glCreateShader(GL_VERTEX_SHADER);
  GLuint frag_shader = glCreateShader(GL_FRAGMENT_SHADER);

#ifdef __APPLE__
  std::string version = "#version 150\n";
#else
  std::string version = "#version 130\n";
#endif

  std::string vert_shader_src = version + std::string("in vec4 coord;"
  "\nout vec2 texpos;"
  "\nvoid main(void) {"
  "\n  gl_Position = vec4(coord.xy, 0, 1);"
  "\n  texpos = coord.zw;"
  "\n}");

  std::string frag_shader_src = version + std::string("uniform sampler2D tex;"
  "\nuniform vec4 color;"
  "\nin vec2 texpos;"
  "\nout vec4 fragColor;"
  "\nvoid main(void) {"
  "\n  fragColor = vec4(1, 1, 1, texture(tex, texpos).r) * color;"
  "\n}");

// with drop shadow
//  "\nvarying vec2 texpos;"
//  "\nuniform sampler2D tex;"
//  "\nuniform vec4 color;"
//  "\n"
//  "\nconst float smoothing = 1.0/4.0;"
//  "\nconst vec2 shadowOffset = vec2(-1.0/512.0);"
//  "\nconst vec4 glowColor = vec4(vec3(0.1), 1.0);"
//  "\nconst float glowMin = 0.2;"
//  "\nconst float glowMax = 0.8;"
//  "\n"
//  "\n// drop shadow computed in fragment shader"
//  "\nvoid main() {"
//  "\n    vec4 texColor = texture2D(tex, texpos);"
//  "\n    float dst = texColor.a;"
//  "\n    float alpha = smoothstep(0.5 - smoothing, 0.5 + smoothing, dst);"
//  "\n"
//  "\n    float glowDst = texture2D(tex, texpos + shadowOffset).a;"
//  "\n    vec4 glow = glowColor * smoothstep(glowMin, glowMax, glowDst);"
//  "\n"
//  "\n    float mask = 1.0-alpha;"
//  "\n"
//  "\n    vec4 base = color * vec4(vec3(1.0), dst);"
//  "\n    gl_FragColor = mix(base, glow, mask);"
//  "\n}";

  GLint result = GL_FALSE;
  int info_length;

  // compile Vertex Shader
  const char* src = vert_shader_src.c_str();
  glShaderSource(vert_shader, 1, &src, NULL);
  glCompileShader(vert_shader);

  // check Vertex Shader
  glGetShaderiv(vert_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(vert_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> vert_shader_errmsg(info_length+1);
    glGetShaderInfoLog(vert_shader, info_length, NULL, &vert_shader_errmsg[0]);
    printf("%s\n", &vert_shader_errmsg[0]);
  }

  // compile Fragment Shader
  src = frag_shader_src.c_str();
  glShaderSource(frag_shader, 1, &src, NULL);
  glCompileShader(frag_shader);

  // check Fragment Shader
  glGetShaderiv(frag_shader, GL_COMPILE_STATUS, &result);
  glGetShaderiv(frag_shader, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> frag_shader_errmsg(info_length+1);
    glGetShaderInfoLog(frag_shader, info_length, NULL, &frag_shader_errmsg[0]);
    printf("%s\n", &frag_shader_errmsg[0]);
  }

  // link the program
  GLuint program_id = glCreateProgram();
  glAttachShader(program_id, vert_shader);
  glAttachShader(program_id, frag_shader);
  glLinkProgram(program_id);

  // check the program
  glGetProgramiv(program_id, GL_LINK_STATUS, &result);
  glGetProgramiv(program_id, GL_INFO_LOG_LENGTH, &info_length);
  if ( info_length > 0 ){
    vector<char> program_errmsg(info_length+1);
    glGetProgramInfoLog(program_id, info_length, NULL, &program_errmsg[0]);
    printf("%s\n", &program_errmsg[0]);
  }

  if (!result) {
    // get the length of the error message
    GLint errorMessageLength;
    glGetProgramiv(program_id, GL_INFO_LOG_LENGTH, &errorMessageLength);

    // get the error message itself
    char* errorMessage = new char[errorMessageLength];
    glGetProgramInfoLog(program_id, errorMessageLength, &errorMessageLength, errorMessage);

    // print it
    printf("GLSL Linker Error:\n");
    printf("================================================================================\n");
    printf("%s\n", errorMessage);
    printf("\n");

    delete [] errorMessage;
  }


  // glDetachShader(1, vert_shader);
  // glDetachShader(1, frag_shader);
  // glDeleteShader(vert_shader);
  // glDeleteShader(frag_shader);

  return program_id;
}